

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtdump.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_222f::dumper::dump_csi_function(dumper *this,string *args,char function)

{
  int iVar1;
  ulong uVar2;
  ostream *poVar3;
  mnemonic *entry;
  mnemonic *__end1;
  mnemonic *__begin1;
  mnemonic (*__range1) [19];
  char function_local;
  string *args_local;
  dumper *this_local;
  
  iVar1 = isalpha((int)function);
  if (iVar1 == 0) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LegalizeAdulthood[P]vteffect/vtdump/vtdump.cpp"
                  ,0x72,
                  "void (anonymous namespace)::dumper::dump_csi_function(const std::string &, char)"
                 );
  }
  __end1 = dump_csi_function::mnemonics;
  while( true ) {
    if ((Elf64_Dyn *)__end1 == _DYNAMIC) {
      poVar3 = std::operator<<((ostream *)&std::cout,"esc\n\"[");
      poVar3 = std::operator<<(poVar3,(string *)args);
      poVar3 = std::operator<<(poVar3,function);
      std::operator<<(poVar3,"\"\n");
      return;
    }
    if (function == __end1->prefix) break;
    __end1 = __end1 + 1;
  }
  std::operator<<((ostream *)&std::cout,__end1->mnemonic);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout," \"");
    poVar3 = std::operator<<(poVar3,(string *)args);
    std::operator<<(poVar3,'\"');
  }
  std::operator<<((ostream *)&std::cout,'\n');
  return;
}

Assistant:

void dumper::dump_csi_function(const std::string &args, char function)
{
    if (!std::isalpha(function))
    {
        assert(false);
    }

    static const mnemonic mnemonics[] =
    {
        { 'A', "cuu" },
        { 'B', "cud" },
        { 'C', "cuf" },
        { 'D', "cub" },
        { 'H', "cup" },
        { 'J', "ed" },
        { 'K', "el" },
        { 'R', "cpr" },
        { 'c', "da" },
        { 'f', "hvp" },
        { 'g', "tbc" },
        { 'h', "sm" },
        { 'l', "rm" },
        { 'm', "sgr" },
        { 'n', "dsr" },
        { 'q', "decll" },
        { 'r', "decstbm" },
        { 'x', "decreqtparm" },
        { 'y', "dectst" }
    };
    for (const auto &entry : mnemonics)
    {
        if (function == entry.prefix)
        {
            std::cout << entry.mnemonic;
            if (!args.empty())
            {
                std::cout << " \"" << args << '"';
            }
            std::cout << '\n';
            return;
        }
    }
    std::cout << "esc\n\"[" << args << function << "\"\n";
}